

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

size_t mg_parse_multipart(char *buf,size_t buf_len,char *var_name,size_t var_name_len,
                         char *file_name,size_t file_name_len,char **data,size_t *data_len)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  mg_str header;
  mg_str local_40;
  
  if ((((buf_len == 0 || buf == (char *)0x0) ||
       (iVar2 = get_request_len(buf,(int)buf_len), iVar2 == 0)) || (*buf != '-')) ||
     ((buf[1] != '-' || (buf[2] == '\n')))) {
    return 0;
  }
  lVar4 = (long)iVar2;
  sVar7 = 1;
  do {
    if (buf[sVar7 - 1] == '\n') goto LAB_0011036f;
    bVar9 = sVar7 != buf_len;
    sVar7 = sVar7 + 1;
  } while (bVar9);
  sVar7 = 0;
  if (buf[buf_len] == '\n') {
    sVar7 = buf_len + 1;
  }
LAB_0011036f:
  *file_name = '\0';
  *var_name = '\0';
  sVar5 = sVar7;
  do {
    pcVar1 = buf + sVar5;
    lVar8 = 0;
    lVar3 = lVar4 - sVar5;
    lVar6 = lVar8;
    if (lVar3 != 0) {
      do {
        lVar6 = lVar8;
        if (pcVar1[lVar8] == '\n') break;
        lVar8 = lVar8 + 1;
        lVar6 = lVar3;
      } while (lVar3 != lVar8);
    }
    if ((pcVar1[lVar6] != '\n') || (lVar6 + 1 == 0)) {
      if (buf_len <= (lVar4 + sVar7) - 2) {
        return 0;
      }
      pcVar1 = buf + lVar4;
      lVar6 = 0;
      while ((pcVar1[lVar6] != '-' || (iVar2 = bcmp(buf,pcVar1 + lVar6,sVar7 - 2), iVar2 != 0))) {
        lVar3 = lVar6 + lVar4 + (sVar7 - 2);
        lVar6 = lVar6 + 1;
        if (buf_len <= lVar3 + 1U) {
          return 0;
        }
      }
      if (data_len != (size_t *)0x0) {
        *data_len = lVar6 - 2;
      }
      if (data != (char **)0x0) {
        *data = pcVar1;
        return lVar4 + lVar6;
      }
      return lVar4 + lVar6;
    }
    iVar2 = mg_ncasecmp("Content-Disposition: ",pcVar1,0x15);
    if (iVar2 == 0) {
      local_40.p = pcVar1 + 0x15;
      local_40.len = lVar6 - 0x16;
      mg_http_parse_header(&local_40,"name",var_name,var_name_len);
      mg_http_parse_header(&local_40,"filename",file_name,file_name_len);
    }
    sVar5 = sVar5 + lVar6 + 1;
  } while( true );
}

Assistant:

size_t mg_parse_multipart(const char *buf, size_t buf_len, char *var_name,
                          size_t var_name_len, char *file_name,
                          size_t file_name_len, const char **data,
                          size_t *data_len) {
    static const char cd[] = "Content-Disposition: ";
    size_t hl, bl, n, ll, pos, cdl = sizeof(cd) - 1;

    if (buf == NULL || buf_len <= 0) return 0;
    if ((hl = get_request_len(buf, buf_len)) <= 0) return 0;
    if (buf[0] != '-' || buf[1] != '-' || buf[2] == '\n') return 0;

    /* Get boundary length */
    bl = get_line_len(buf, buf_len);

    /* Loop through headers, fetch variable name and file name */
    var_name[0] = file_name[0] = '\0';
    for (n = bl; (ll = get_line_len(buf + n, hl - n)) > 0; n += ll) {
        if (mg_ncasecmp(cd, buf + n, cdl) == 0) {
            struct mg_str header;
            header.p = buf + n + cdl;
            header.len = ll - (cdl + 2);
            mg_http_parse_header(&header, "name", var_name, var_name_len);
            mg_http_parse_header(&header, "filename", file_name, file_name_len);
        }
    }

    /* Scan through the body, search for terminating boundary */
    for (pos = hl; pos + (bl - 2) < buf_len; pos++) {
        if (buf[pos] == '-' && !memcmp(buf, &buf[pos], bl - 2)) {
            if (data_len != NULL) *data_len = (pos - 2) - hl;
            if (data != NULL) *data = buf + hl;
            return pos;
        }
    }

    return 0;
}